

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  buffer_appender<char> this_00;
  ssize_t extraout_RAX;
  char local_11 [8];
  char value_local;
  
  this_00 = reserve(this,1);
  buffer<char>::push_back
            ((buffer<char> *)
             this_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,local_11);
  return extraout_RAX;
}

Assistant:

void write(char value) {
    auto&& it = reserve(1);
    *it++ = value;
  }